

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O1

void usage(void)

{
  fprintf(_stderr,"Usage: %s COMMAND [OPTIONS] <<filename>.<suffix> | <absolute_filename_path>>\n\n"
          ,"econftool");
  fwrite("If <absolute_filename_path> (begins with \"/\") is given, only this\n",0x42,1,_stderr);
  fwrite("file will be parsed.\n",0x15,1,_stderr);
  fwrite("Otherwise different files in /etc /usr/vendor and */<filename>.suffix.d/\n",0x49,1,_stderr
        );
  fwrite("directories will be parsed.\n\n",0x1d,1,_stderr);
  fwrite("COMMANDS:\n",10,1,_stderr);
  fwrite("show     reads all snippets for <filename>.conf (in /usr/etc and /etc),\n",0x48,1,_stderr)
  ;
  fwrite("         and prints all groups,keys and their values.\n",0x36,1,_stderr);
  fwrite("         The root directories is /. It can be set by the environment\n",0x45,1,_stderr);
  fwrite("         variable $ECONFTOOL_ROOT \n",0x23,1,_stderr);
  fwrite("cat      prints the content of the files and the name of the file in the order\n",0x4f,1,
         _stderr);
  fwrite("         as it has been read.\n",0x1e,1,_stderr);
  fwrite("syntax   checks the syntax, prints parsing errors and returns 1 if an error\n",0x4c,1,
         _stderr);
  fwrite("         has been found (otherwise 0).\n",0x27,1,_stderr);
  fwrite("         as it has been read.\n",0x1e,1,_stderr);
  fwrite("edit     starts the editor $EDITOR (environment variable) where the\n",0x44,1,_stderr);
  fwrite("         groups, keys and values can be modified and saved afterwards.\n",0x47,1,_stderr);
  fwrite("  -f, --full:      copy the original configuration file to /etc instead of\n",0x4b,1,
         _stderr);
  fwrite("                   creating drop-in files.\n",0x2b,1,_stderr);
  fwrite("  --use-home:      only has an effect if the user is root.\n",0x3b,1,_stderr);
  fwrite("                   chooses the root home directory instead of /etc.\n",0x44,1,_stderr);
  fwrite("revert   reverts all changes to the vendor versions. Basically deletes\n",0x47,1,_stderr);
  fwrite("         the config file and snippet directory in /etc.\n",0x38,1,_stderr);
  fwrite("  -y, --yes:       assumes yes for all prompts and runs non-interactively.\n\n",0x4c,1,
         _stderr);
  fwrite("\ngeneral Options:\n",0x12,1,_stderr);
  fwrite("--comment <character>: Character which starts a comment. (\'#\' default).\n",0x48,1,
         _stderr);
  fwrite("--delimiters <string>: Characters which separates key/value entries. (\"=\" default).\n",
         0x54,1,_stderr);
  fwrite("                       e.g. --delimiters=\"= \\t\"\n",0x30,1,_stderr);
  fwrite("                       e.g. --delimiters=spaces   regarding all spaces\n",0x47,1,_stderr);
  return;
}

Assistant:

static void usage(void)
{
    fprintf(stderr, "Usage: %s COMMAND [OPTIONS] <<filename>.<suffix> | <absolute_filename_path>>\n\n", utilname);
    fprintf(stderr, "If <absolute_filename_path> (begins with \"/\") is given, only this\n");
    fprintf(stderr, "file will be parsed.\n");
    fprintf(stderr, "Otherwise different files in /etc /usr/vendor and */<filename>.suffix.d/\n");
    fprintf(stderr, "directories will be parsed.\n\n");
    fprintf(stderr, "COMMANDS:\n");
    fprintf(stderr, "show     reads all snippets for <filename>.conf (in /usr/etc and /etc),\n");
    fprintf(stderr, "         and prints all groups,keys and their values.\n");
    fprintf(stderr, "         The root directories is /. It can be set by the environment\n");
    fprintf(stderr, "         variable $ECONFTOOL_ROOT \n");
    fprintf(stderr, "cat      prints the content of the files and the name of the file in the order\n");
    fprintf(stderr, "         as it has been read.\n");
    fprintf(stderr, "syntax   checks the syntax, prints parsing errors and returns 1 if an error\n");
    fprintf(stderr, "         has been found (otherwise 0).\n");
    fprintf(stderr, "         as it has been read.\n");
    fprintf(stderr, "edit     starts the editor $EDITOR (environment variable) where the\n");
    fprintf(stderr, "         groups, keys and values can be modified and saved afterwards.\n");
    fprintf(stderr, "  -f, --full:      copy the original configuration file to /etc instead of\n");
    fprintf(stderr, "                   creating drop-in files.\n");
    fprintf(stderr, "  --use-home:      only has an effect if the user is root.\n");
    fprintf(stderr, "                   chooses the root home directory instead of /etc.\n");
    fprintf(stderr, "revert   reverts all changes to the vendor versions. Basically deletes\n");
    fprintf(stderr, "         the config file and snippet directory in /etc.\n");
    fprintf(stderr, "  -y, --yes:       assumes yes for all prompts and runs non-interactively.\n\n");
    fprintf(stderr, "\ngeneral Options:\n");
    fprintf(stderr, "--comment <character>: Character which starts a comment. ('#' default).\n");
    fprintf(stderr, "--delimiters <string>: Characters which separates key/value entries. (\"=\" default).\n");
    fprintf(stderr, "                       e.g. --delimiters=\"= \\t\"\n");
    fprintf(stderr, "                       e.g. --delimiters=spaces   regarding all spaces\n");
}